

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O1

Kit_Edge_t Kit_GraphAddNodeXor(Kit_Graph_t *pGraph,Kit_Edge_t eEdge0,Kit_Edge_t eEdge1,int Type)

{
  int iVar1;
  Kit_Node_t *pKVar2;
  Kit_Edge_t KVar3;
  
  KVar3 = (Kit_Edge_t)((uint)eEdge1 ^ 1);
  if (Type != 0) {
    pKVar2 = Kit_GraphAppendNode(pGraph);
    pKVar2->eEdge0 = eEdge0;
    pKVar2->eEdge1 = eEdge1;
    *(uint *)&pKVar2->field_0x10 =
         ((uint)eEdge1 & 1) << 0x10 | ((uint)eEdge0 & 1) << 0xf |
         *(uint *)&pKVar2->field_0x10 & 0xfffe7fff;
    iVar1 = pGraph->nSize;
    pKVar2 = Kit_GraphAppendNode(pGraph);
    pKVar2->eEdge0 = (Kit_Edge_t)((uint)eEdge0 ^ 1);
    pKVar2->eEdge1 = KVar3;
    *(uint *)&pKVar2->field_0x10 =
         ((uint)KVar3 & 1) << 0x10 | (((uint)eEdge0 ^ 1) & 1) << 0xf |
         *(uint *)&pKVar2->field_0x10 & 0xfffe7fff;
    KVar3 = Kit_GraphAddNodeOr(pGraph,(Kit_Edge_t)(iVar1 * 2 + 0x7ffffffeU & 0x7ffffffe),
                               (Kit_Edge_t)(pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe));
    return (Kit_Edge_t)((uint)KVar3 ^ 1);
  }
  pKVar2 = Kit_GraphAppendNode(pGraph);
  pKVar2->eEdge0 = (Kit_Edge_t)((uint)eEdge0 ^ 1);
  pKVar2->eEdge1 = eEdge1;
  *(uint *)&pKVar2->field_0x10 =
       ((uint)eEdge1 & 1) << 0x10 | (((uint)eEdge0 ^ 1) & 1) << 0xf |
       *(uint *)&pKVar2->field_0x10 & 0xfffe7fff;
  iVar1 = pGraph->nSize;
  pKVar2 = Kit_GraphAppendNode(pGraph);
  pKVar2->eEdge0 = eEdge0;
  pKVar2->eEdge1 = KVar3;
  *(uint *)&pKVar2->field_0x10 =
       ((uint)KVar3 & 1) << 0x10 | ((uint)eEdge0 & 1) << 0xf |
       *(uint *)&pKVar2->field_0x10 & 0xfffe7fff;
  KVar3 = Kit_GraphAddNodeOr(pGraph,(Kit_Edge_t)(iVar1 * 2 + 0x7ffffffeU & 0x7ffffffe),
                             (Kit_Edge_t)(pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe));
  return KVar3;
}

Assistant:

Kit_Edge_t Kit_GraphAddNodeXor( Kit_Graph_t * pGraph, Kit_Edge_t eEdge0, Kit_Edge_t eEdge1, int Type )
{
    Kit_Edge_t eNode0, eNode1, eNode;
    if ( Type == 0 )
    {
        // derive the first AND
        eEdge0.fCompl ^= 1;
        eNode0 = Kit_GraphAddNodeAnd( pGraph, eEdge0, eEdge1 );
        eEdge0.fCompl ^= 1;
        // derive the second AND
        eEdge1.fCompl ^= 1;
        eNode1 = Kit_GraphAddNodeAnd( pGraph, eEdge0, eEdge1 );
        // derive the final OR
        eNode = Kit_GraphAddNodeOr( pGraph, eNode0, eNode1 );
    }
    else
    {
        // derive the first AND
        eNode0 = Kit_GraphAddNodeAnd( pGraph, eEdge0, eEdge1 );
        // derive the second AND
        eEdge0.fCompl ^= 1;
        eEdge1.fCompl ^= 1;
        eNode1 = Kit_GraphAddNodeAnd( pGraph, eEdge0, eEdge1 );
        // derive the final OR
        eNode = Kit_GraphAddNodeOr( pGraph, eNode0, eNode1 );
        eNode.fCompl ^= 1;
    }
    return eNode;
}